

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O3

void __thiscall ODDLParser::Reference::Reference(Reference *this,Reference *ref)

{
  ulong uVar1;
  Name **ppNVar2;
  Name *this_00;
  ulong uVar3;
  
  uVar1 = ref->m_numRefs;
  this->m_numRefs = uVar1;
  if (uVar1 != 0) {
    uVar3 = 0;
    ppNVar2 = (Name **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    this->m_referencedName = ppNVar2;
    do {
      this_00 = (Name *)operator_new(0x10);
      Name::Name(this_00,ref->m_referencedName[uVar3]);
      this->m_referencedName[uVar3] = this_00;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->m_numRefs);
  }
  return;
}

Assistant:

Reference::Reference(const Reference &ref) {
    m_numRefs=ref.m_numRefs;
    if(m_numRefs!=0){
        m_referencedName = new Name*[m_numRefs];
        for ( size_t i = 0; i < m_numRefs; i++ ) {
            m_referencedName[i] = new Name(*ref.m_referencedName[i]);
        }
    }
}